

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O3

Vector * BiCGIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                 double OmegaPrecond)

{
  bool bVar1;
  double bNorm;
  double dVar2;
  Boolean BVar3;
  LASErrIdType LVar4;
  size_t Dim;
  Vector *pVVar5;
  QMatrix *pQVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  Vector r;
  Vector r_;
  Vector z_;
  Vector p;
  Vector q;
  Vector p_;
  Vector z;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  Vector local_180;
  Vector local_150;
  Vector local_120;
  Vector local_f0;
  Vector local_c0;
  Vector local_90;
  Vector local_60;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&local_180,"r",Dim,Normal,True);
  V_Constr(&local_150,"r_",Dim,Normal,True);
  V_Constr(&local_f0,"p",Dim,Normal,True);
  V_Constr(&local_90,"p_",Dim,Normal,True);
  V_Constr(&local_c0,"q",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar3 = Q_KerDefined(A), BVar3 != False)) {
    V_Constr(&local_60,"z",Dim,Normal,True);
    V_Constr(&local_120,"z_",Dim,Normal,True);
  }
  LVar4 = LASResult();
  if (LVar4 != LASOK) goto LAB_00108783;
  bNorm = l2Norm_V(b);
  dVar2 = l1Norm_V(x);
  auVar9._8_4_ = (int)(Dim >> 0x20);
  auVar9._0_8_ = Dim;
  auVar9._12_4_ = 0x45300000;
  pVVar5 = b;
  if (2.2250738585072014e-307 <=
      ABS(dVar2 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
    BVar3 = Q_KerDefined(A);
    if (BVar3 != False) {
      OrthoRightKer_VQ(x,A);
    }
    pVVar5 = Mul_QV(A,x);
    pVVar5 = Sub_VV(b,pVVar5);
  }
  Asgn_VV(&local_180,pVVar5);
  if ((PrecondProc == (PrecondProcType)0x0) && (BVar3 = Q_KerDefined(A), BVar3 == False)) {
    Asgn_VV(&local_150,&local_180);
    dVar2 = l2Norm_V(&local_180);
    BVar3 = RTCResult(0,dVar2,bNorm,BiCGIterId);
    if (0 < MaxIter && BVar3 == False) {
      local_1a8 = 0;
      uStack_1a4 = 0;
      iVar7 = 1;
      do {
        dVar2 = Mul_VV(&local_180,&local_150);
        if (ABS(dVar2) < 2.2250738585072014e-307) goto LAB_00108745;
        if (iVar7 == 1) {
          Asgn_VV(&local_f0,&local_180);
          pVVar5 = &local_150;
        }
        else {
          dVar8 = dVar2 / (double)CONCAT44(uStack_1a4,local_1a8);
          pVVar5 = Mul_SV(dVar8,&local_f0);
          pVVar5 = Add_VV(&local_180,pVVar5);
          Asgn_VV(&local_f0,pVVar5);
          pVVar5 = Mul_SV(dVar8,&local_90);
          pVVar5 = Add_VV(&local_150,pVVar5);
        }
        Asgn_VV(&local_90,pVVar5);
        pVVar5 = Mul_QV(A,&local_f0);
        Asgn_VV(&local_c0,pVVar5);
        dVar8 = Mul_VV(&local_90,&local_c0);
        dVar8 = dVar2 / dVar8;
        pVVar5 = Mul_SV(dVar8,&local_f0);
        AddAsgn_VV(x,pVVar5);
        pVVar5 = Mul_SV(dVar8,&local_c0);
        SubAsgn_VV(&local_180,pVVar5);
        pQVar6 = Transp_Q(A);
        pVVar5 = Mul_QV(pQVar6,&local_90);
        pVVar5 = Mul_SV(dVar8,pVVar5);
        SubAsgn_VV(&local_150,pVVar5);
        dVar8 = l2Norm_V(&local_180);
        BVar3 = RTCResult(iVar7,dVar8,bNorm,BiCGIterId);
        if (BVar3 != False) break;
        local_1a8 = SUB84(dVar2,0);
        uStack_1a4 = (undefined4)((ulong)dVar2 >> 0x20);
        bVar1 = iVar7 < MaxIter;
        iVar7 = iVar7 + 1;
      } while (bVar1);
    }
  }
  else {
    Asgn_VV(&local_150,&local_180);
    dVar2 = l2Norm_V(&local_180);
    BVar3 = RTCResult(0,dVar2,bNorm,BiCGIterId);
    if (0 < MaxIter && BVar3 == False) {
      local_1a8 = 0;
      uStack_1a4 = 0;
      iVar7 = 1;
      do {
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV(&local_60,&local_180);
        }
        else {
          (*PrecondProc)(A,&local_60,&local_180,OmegaPrecond);
        }
        BVar3 = Q_KerDefined(A);
        if (BVar3 != False) {
          OrthoRightKer_VQ(&local_60,A);
        }
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV(&local_120,&local_150);
        }
        else {
          pQVar6 = Transp_Q(A);
          (*PrecondProc)(pQVar6,&local_120,&local_150,OmegaPrecond);
        }
        BVar3 = Q_KerDefined(A);
        if (BVar3 != False) {
          pQVar6 = Transp_Q(A);
          OrthoRightKer_VQ(&local_120,pQVar6);
        }
        dVar2 = Mul_VV(&local_60,&local_150);
        if (ABS(dVar2) < 2.2250738585072014e-307) goto LAB_00108745;
        if (iVar7 == 1) {
          Asgn_VV(&local_f0,&local_60);
          pVVar5 = &local_120;
        }
        else {
          dVar8 = dVar2 / (double)CONCAT44(uStack_1a4,local_1a8);
          pVVar5 = Mul_SV(dVar8,&local_f0);
          pVVar5 = Add_VV(&local_60,pVVar5);
          Asgn_VV(&local_f0,pVVar5);
          pVVar5 = Mul_SV(dVar8,&local_90);
          pVVar5 = Add_VV(&local_120,pVVar5);
        }
        Asgn_VV(&local_90,pVVar5);
        pVVar5 = Mul_QV(A,&local_f0);
        Asgn_VV(&local_c0,pVVar5);
        dVar8 = Mul_VV(&local_90,&local_c0);
        dVar8 = dVar2 / dVar8;
        pVVar5 = Mul_SV(dVar8,&local_f0);
        AddAsgn_VV(x,pVVar5);
        pVVar5 = Mul_SV(dVar8,&local_c0);
        SubAsgn_VV(&local_180,pVVar5);
        pQVar6 = Transp_Q(A);
        pVVar5 = Mul_QV(pQVar6,&local_90);
        pVVar5 = Mul_SV(dVar8,pVVar5);
        SubAsgn_VV(&local_150,pVVar5);
        dVar8 = l2Norm_V(&local_180);
        BVar3 = RTCResult(iVar7,dVar8,bNorm,BiCGIterId);
        if (BVar3 != False) break;
        local_1a8 = SUB84(dVar2,0);
        uStack_1a4 = (undefined4)((ulong)dVar2 >> 0x20);
        bVar1 = iVar7 < MaxIter;
        iVar7 = iVar7 + 1;
      } while (bVar1);
    }
  }
LAB_00108762:
  BVar3 = Q_KerDefined(A);
  if (BVar3 != False) {
    OrthoRightKer_VQ(x,A);
  }
LAB_00108783:
  V_Destr(&local_180);
  V_Destr(&local_150);
  V_Destr(&local_f0);
  V_Destr(&local_90);
  V_Destr(&local_c0);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar3 = Q_KerDefined(A), BVar3 != False)) {
    V_Destr(&local_60);
    V_Destr(&local_120);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
LAB_00108745:
  LASError(LASBreakdownErr,"BiCGIter","Rho",(char *)0x0,(char *)0x0);
  goto LAB_00108762;
}

Assistant:

Vector *BiCGIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, q, z, z_;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&p_, "p_", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Constr(&z, "z", Dim, Normal, True);
        V_Constr(&z_, "z_", Dim, Normal, True);
    }

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned BiCG */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
		if (PrecondProc != NULL)
                    (*PrecondProc)(Transp_Q(A), &z_, &r_, OmegaPrecond);
		else
		    Asgn_VV(&z_, &r_);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z_, Transp_Q(A));
                Rho = Mul_VV(&z, &r_);
                if (IsZero(Rho)){
                    LASError(LASBreakdownErr, "BiCGIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                    Asgn_VV(&p_, &z_);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                    Asgn_VV(&p_, Add_VV(&z_, Mul_SV(Beta, &p_)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p_, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                SubAsgn_VV(&r_, Mul_SV(Alpha, Mul_QV(Transp_Q(A), &p_)));
                RhoOld = Rho;
            }
        } else {
            /* plain BiCG (z = r, z_ = r_) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r, &r_);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "BiCGIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                    Asgn_VV(&p_, &r_);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, &p)));
                    Asgn_VV(&p_, Add_VV(&r_, Mul_SV(Beta, &p_)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p_, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                SubAsgn_VV(&r_, Mul_SV(Alpha, Mul_QV(Transp_Q(A), &p_)));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&p_);
    V_Destr(&q);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Destr(&z);
        V_Destr(&z_);
    }

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}